

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O2

void ScaleARGBRowDownEvenBox_SSE2
               (uint8_t *src_argb,ptrdiff_t src_stride,int src_stepx,uint8_t *dst_argb,int dst_width
               )

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  long lVar10;
  uint8_t *puVar11;
  int iVar12;
  undefined1 uVar13;
  uint8_t uVar14;
  undefined1 uVar15;
  uint8_t uVar16;
  undefined1 uVar17;
  uint8_t uVar18;
  undefined1 uVar19;
  uint8_t uVar20;
  undefined1 uVar21;
  uint8_t uVar22;
  undefined1 uVar23;
  uint8_t uVar24;
  undefined1 uVar25;
  uint8_t uVar26;
  undefined1 uVar27;
  uint8_t uVar28;
  undefined1 uVar29;
  uint8_t uVar30;
  undefined1 uVar31;
  uint8_t uVar32;
  undefined1 uVar33;
  uint8_t uVar34;
  undefined1 uVar35;
  uint8_t uVar36;
  undefined1 uVar37;
  uint8_t uVar38;
  undefined1 uVar39;
  uint8_t uVar40;
  undefined1 uVar41;
  uint8_t uVar42;
  undefined1 uVar43;
  uint8_t uVar44;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 uVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined1 uVar53;
  undefined1 uVar54;
  undefined1 uVar55;
  undefined1 uVar56;
  undefined1 uVar57;
  undefined1 uVar58;
  undefined1 uVar59;
  undefined1 uVar60;
  int dst_width_local;
  
  lVar10 = (long)src_stepx;
  puVar11 = src_argb + src_stride;
  do {
    uVar1 = *(undefined8 *)src_argb;
    uVar2 = *(undefined8 *)(src_argb + lVar10 * 4);
    uVar3 = *(undefined8 *)(src_argb + lVar10 * 8);
    uVar4 = *(undefined8 *)(src_argb + lVar10 * 0xc);
    src_argb = src_argb + lVar10 * 0x10;
    uVar5 = *(undefined8 *)puVar11;
    uVar6 = *(undefined8 *)(puVar11 + lVar10 * 4);
    uVar7 = *(undefined8 *)(puVar11 + lVar10 * 8);
    uVar8 = *(undefined8 *)(puVar11 + lVar10 * 0xc);
    puVar11 = puVar11 + lVar10 * 0x10;
    uVar13 = pavgb((char)uVar1,(char)uVar5);
    uVar15 = pavgb((char)((ulong)uVar1 >> 8),(char)((ulong)uVar5 >> 8));
    uVar17 = pavgb((char)((ulong)uVar1 >> 0x10),(char)((ulong)uVar5 >> 0x10));
    uVar19 = pavgb((char)((ulong)uVar1 >> 0x18),(char)((ulong)uVar5 >> 0x18));
    uVar21 = pavgb((char)((ulong)uVar1 >> 0x20),(char)((ulong)uVar5 >> 0x20));
    uVar23 = pavgb((char)((ulong)uVar1 >> 0x28),(char)((ulong)uVar5 >> 0x28));
    uVar25 = pavgb((char)((ulong)uVar1 >> 0x30),(char)((ulong)uVar5 >> 0x30));
    uVar27 = pavgb((char)((ulong)uVar1 >> 0x38),(char)((ulong)uVar5 >> 0x38));
    uVar29 = pavgb((char)uVar2,(char)uVar6);
    uVar31 = pavgb((char)((ulong)uVar2 >> 8),(char)((ulong)uVar6 >> 8));
    uVar33 = pavgb((char)((ulong)uVar2 >> 0x10),(char)((ulong)uVar6 >> 0x10));
    uVar35 = pavgb((char)((ulong)uVar2 >> 0x18),(char)((ulong)uVar6 >> 0x18));
    uVar37 = pavgb((char)((ulong)uVar2 >> 0x20),(char)((ulong)uVar6 >> 0x20));
    uVar39 = pavgb((char)((ulong)uVar2 >> 0x28),(char)((ulong)uVar6 >> 0x28));
    uVar41 = pavgb((char)((ulong)uVar2 >> 0x30),(char)((ulong)uVar6 >> 0x30));
    uVar43 = pavgb((char)((ulong)uVar2 >> 0x38),(char)((ulong)uVar6 >> 0x38));
    uVar45 = pavgb((char)uVar3,(char)uVar7);
    uVar46 = pavgb((char)((ulong)uVar3 >> 8),(char)((ulong)uVar7 >> 8));
    uVar47 = pavgb((char)((ulong)uVar3 >> 0x10),(char)((ulong)uVar7 >> 0x10));
    uVar48 = pavgb((char)((ulong)uVar3 >> 0x18),(char)((ulong)uVar7 >> 0x18));
    uVar49 = pavgb((char)((ulong)uVar3 >> 0x20),(char)((ulong)uVar7 >> 0x20));
    uVar50 = pavgb((char)((ulong)uVar3 >> 0x28),(char)((ulong)uVar7 >> 0x28));
    uVar51 = pavgb((char)((ulong)uVar3 >> 0x30),(char)((ulong)uVar7 >> 0x30));
    uVar52 = pavgb((char)((ulong)uVar3 >> 0x38),(char)((ulong)uVar7 >> 0x38));
    uVar53 = pavgb((char)uVar4,(char)uVar8);
    uVar54 = pavgb((char)((ulong)uVar4 >> 8),(char)((ulong)uVar8 >> 8));
    uVar55 = pavgb((char)((ulong)uVar4 >> 0x10),(char)((ulong)uVar8 >> 0x10));
    uVar56 = pavgb((char)((ulong)uVar4 >> 0x18),(char)((ulong)uVar8 >> 0x18));
    uVar57 = pavgb((char)((ulong)uVar4 >> 0x20),(char)((ulong)uVar8 >> 0x20));
    uVar58 = pavgb((char)((ulong)uVar4 >> 0x28),(char)((ulong)uVar8 >> 0x28));
    uVar59 = pavgb((char)((ulong)uVar4 >> 0x30),(char)((ulong)uVar8 >> 0x30));
    uVar60 = pavgb((char)((ulong)uVar4 >> 0x38),(char)((ulong)uVar8 >> 0x38));
    uVar14 = pavgb(uVar13,uVar21);
    uVar16 = pavgb(uVar15,uVar23);
    uVar18 = pavgb(uVar17,uVar25);
    uVar20 = pavgb(uVar19,uVar27);
    uVar22 = pavgb(uVar29,uVar37);
    uVar24 = pavgb(uVar31,uVar39);
    uVar26 = pavgb(uVar33,uVar41);
    uVar28 = pavgb(uVar35,uVar43);
    uVar30 = pavgb(uVar45,uVar49);
    uVar32 = pavgb(uVar46,uVar50);
    uVar34 = pavgb(uVar47,uVar51);
    uVar36 = pavgb(uVar48,uVar52);
    uVar38 = pavgb(uVar53,uVar57);
    uVar40 = pavgb(uVar54,uVar58);
    uVar42 = pavgb(uVar55,uVar59);
    uVar44 = pavgb(uVar56,uVar60);
    *dst_argb = uVar14;
    dst_argb[1] = uVar16;
    dst_argb[2] = uVar18;
    dst_argb[3] = uVar20;
    dst_argb[4] = uVar22;
    dst_argb[5] = uVar24;
    dst_argb[6] = uVar26;
    dst_argb[7] = uVar28;
    dst_argb[8] = uVar30;
    dst_argb[9] = uVar32;
    dst_argb[10] = uVar34;
    dst_argb[0xb] = uVar36;
    dst_argb[0xc] = uVar38;
    dst_argb[0xd] = uVar40;
    dst_argb[0xe] = uVar42;
    dst_argb[0xf] = uVar44;
    dst_argb = dst_argb + 0x10;
    iVar12 = dst_width + -4;
    bVar9 = 3 < dst_width;
    dst_width = iVar12;
  } while (iVar12 != 0 && bVar9);
  return;
}

Assistant:

void ScaleARGBRowDownEvenBox_SSE2(const uint8_t* src_argb,
                                  ptrdiff_t src_stride,
                                  int src_stepx,
                                  uint8_t* dst_argb,
                                  int dst_width) {
  intptr_t src_stepx_x4 = (intptr_t)(src_stepx);
  intptr_t src_stepx_x12;
  intptr_t row1 = (intptr_t)(src_stride);
  asm volatile(
      "lea         0x00(,%1,4),%1                \n"
      "lea         0x00(%1,%1,2),%4              \n"
      "lea         0x00(%0,%5,1),%5              \n"

      LABELALIGN
      "1:                                        \n"
      "movq        (%0),%%xmm0                   \n"
      "movhps      0x00(%0,%1,1),%%xmm0          \n"
      "movq        0x00(%0,%1,2),%%xmm1          \n"
      "movhps      0x00(%0,%4,1),%%xmm1          \n"
      "lea         0x00(%0,%1,4),%0              \n"
      "movq        (%5),%%xmm2                   \n"
      "movhps      0x00(%5,%1,1),%%xmm2          \n"
      "movq        0x00(%5,%1,2),%%xmm3          \n"
      "movhps      0x00(%5,%4,1),%%xmm3          \n"
      "lea         0x00(%5,%1,4),%5              \n"
      "pavgb       %%xmm2,%%xmm0                 \n"
      "pavgb       %%xmm3,%%xmm1                 \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "shufps      $0x88,%%xmm1,%%xmm0           \n"
      "shufps      $0xdd,%%xmm1,%%xmm2           \n"
      "pavgb       %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "lea         0x10(%2),%2                   \n"
      "sub         $0x4,%3                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),        // %0
        "+r"(src_stepx_x4),    // %1
        "+r"(dst_argb),        // %2
        "+rm"(dst_width),      // %3
        "=&r"(src_stepx_x12),  // %4
        "+r"(row1)             // %5
        ::"memory",
        "cc", "xmm0", "xmm1", "xmm2", "xmm3");
}